

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMLexer.cpp
# Opt level: O1

Token __thiscall cmm::CMMLexer::LexString(CMMLexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  char cVar7;
  TokenKind unaff_R15D;
  int CurChar;
  int local_a0;
  TokenKind local_9c;
  string local_98;
  LocTy local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cVar7 = (char)this + '\x18';
  (this->StrVal)._M_string_length = 0;
  *(this->StrVal)._M_dataplus._M_p = '\0';
  paVar1 = &local_98.field_2;
  do {
    local_a0 = SourceMgr::get(this->SrcMgr);
    if (local_a0 == 0x5c) {
      local_78 = this->SrcMgr->CurrentLoc;
      local_9c = unaff_R15D;
      iVar3 = SourceMgr::get(this->SrcMgr);
      local_a0 = iVar3;
      if (iVar3 == -1) {
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"end of file in string constant after \\","");
        SourceMgr::Error(this->SrcMgr,this->TokStartLoc,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        local_9c = Error;
      }
      else {
        bVar2 = UnEscapeChar(&local_a0);
        if (bVar2) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
          plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11982f);
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_60 = *plVar5;
            lStack_58 = plVar4[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar5;
            local_70 = (long *)*plVar4;
          }
          local_68 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
          psVar6 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_98.field_2._M_allocated_capacity = *psVar6;
            local_98.field_2._8_8_ = plVar4[3];
            local_98._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar6;
            local_98._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_98._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          SourceMgr::Warning(this->SrcMgr,local_78,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          std::__cxx11::string::push_back(cVar7);
        }
      }
      unaff_R15D = local_9c;
      if (iVar3 == -1) {
        bVar2 = false;
      }
      else {
LAB_001067bb:
        std::__cxx11::string::push_back(cVar7);
        bVar2 = true;
      }
    }
    else {
      if (local_a0 == 0x22) {
        unaff_R15D = String;
      }
      else {
        if (local_a0 != -1) goto LAB_001067bb;
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"end of file in string constant","");
        SourceMgr::Error(this->SrcMgr,this->TokStartLoc,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        unaff_R15D = Error;
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return (Token)unaff_R15D;
    }
  } while( true );
}

Assistant:

Token CMMLexer::LexString() {
  StrVal.clear();
  for (;;) {
    int CurChar = getNextChar();

    if (CurChar == '"') {
      // UnEscapeLexed(StrVal);
      return Token::String;
    }

    if (CurChar == std::char_traits<char>::eof()) {
      Error("end of file in string constant");
      return Token::Error;
    }

    if (CurChar == '\\') {
      LocTy Loc = SrcMgr.getLoc();

      CurChar = getNextChar();

      if (CurChar == std::char_traits<char>::eof()) {
        Error("end of file in string constant after \\");
        return Token::Error;
      }

      if (UnEscapeChar(CurChar)) {
        Warning(Loc, "\\" + std::string(1, static_cast<char>(CurChar)) +
            " is an invalid escaping sequence in string literal");
        StrVal.push_back('\\');
      }
    }
    StrVal.push_back(static_cast<char>(CurChar));
  }
}